

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O3

void If_ManRestart(If_Man_t *p)

{
  If_Obj_t *pIVar1;
  
  if (p->pMemCi != (If_Set_t *)0x0) {
    free(p->pMemCi);
    p->pMemCi = (If_Set_t *)0x0;
  }
  p->vCis->nSize = 0;
  p->vCos->nSize = 0;
  p->vObjs->nSize = 0;
  p->vTemp->nSize = 0;
  Mem_FixedRestart(p->pMemObj);
  pIVar1 = If_ManSetupObj(p);
  p->pConst1 = pIVar1;
  *(uint *)pIVar1 = (*(uint *)pIVar1 & 0xfffffff0) + 1;
  *(uint *)p->pConst1 = *(uint *)p->pConst1 | 0x40;
  p->nObjs[4] = 0;
  p->nObjs[2] = 0;
  p->nObjs[3] = 0;
  return;
}

Assistant:

void If_ManRestart( If_Man_t * p )
{
    ABC_FREE( p->pMemCi );
    Vec_PtrClear( p->vCis );
    Vec_PtrClear( p->vCos );
    Vec_PtrClear( p->vObjs );
    Vec_PtrClear( p->vTemp );
    Mem_FixedRestart( p->pMemObj );
    // create the constant node
    p->pConst1 = If_ManSetupObj( p );
    p->pConst1->Type = IF_CONST1;
    p->pConst1->fPhase = 1;
    // reset the counter of other nodes
    p->nObjs[IF_CI] = p->nObjs[IF_CO] = p->nObjs[IF_AND] = 0;
}